

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

parser_error parse_quest_map(parser *p)

{
  long lVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  long *plVar5;
  long lVar6;
  level_map_conflict *plVar7;
  undefined8 *puVar8;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getstr(p,"mapname");
  plVar7 = maps;
  if (pvVar4 == (void *)0x0) {
    __assert_fail("q",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-quest.c"
                  ,0x7a,"enum parser_error parse_quest_map(struct parser *)");
  }
  lVar1 = *(long *)((long)pvVar4 + 0x18);
  if (*(long *)((long)pvVar4 + 0x18) == 0) {
    puVar8 = (undefined8 *)((long)pvVar4 + 0x18);
  }
  else {
    do {
      lVar6 = lVar1;
      lVar1 = *(long *)(lVar6 + 0x10);
    } while (lVar1 != 0);
    puVar8 = (undefined8 *)(lVar6 + 0x10);
  }
  plVar5 = (long *)mem_zalloc(0x18);
  *puVar8 = plVar5;
  while( true ) {
    if (plVar7 == (level_map_conflict *)0x0) {
      pVar3 = PARSE_ERROR_INVALID_MAP;
      if (*plVar5 != 0) {
        pVar3 = PARSE_ERROR_NONE;
      }
      return pVar3;
    }
    iVar2 = strcmp(__s1,plVar7->name);
    if (iVar2 == 0) break;
    plVar7 = plVar7->next;
  }
  *plVar5 = (long)plVar7;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_quest_map(struct parser *p) {
	struct quest *q = parser_priv(p);
	const char *name = parser_getstr(p, "mapname");
	struct level_map *map = maps;
	struct quest_place *q_place = q->place;
	assert(q);

	if (q_place) {
		while (q_place->next) {
			q_place = q_place->next;
		}
		q_place->next = mem_zalloc(sizeof(*(q->place)));
		q_place = q_place->next;
	} else {
		q_place = mem_zalloc(sizeof(*(q->place)));
		q->place = q_place;
	}

	while (map) {
		if (streq(name, map->name)) {
			q_place->map = map;
			break;
		}
		map = map->next;
	}

	if (!q_place->map) return PARSE_ERROR_INVALID_MAP;

	return PARSE_ERROR_NONE;
}